

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O3

void __thiscall
QMimeBinaryProvider::addAllMimeTypes(QMimeBinaryProvider *this,QList<QMimeType> *result)

{
  byte bVar1;
  Entry *pEVar2;
  long lVar3;
  QArrayData *data;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  ulong uVar6;
  bool bVar7;
  Data *pDVar8;
  ulong uVar9;
  const_iterator __it;
  size_t asize;
  long lVar10;
  const_iterator cVar11;
  long lVar12;
  QMimeType *pQVar13;
  long in_FS_OFFSET;
  QMimeTypePrivate local_68;
  QMimeType local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  loadMimeTypeList(this);
  pDVar8 = (this->m_mimetypeNames).q_hash.d;
  if ((result->d).size == 0) {
    if (pDVar8 == (Data *)0x0) {
      asize = 0;
    }
    else {
      asize = pDVar8->size;
    }
    QList<QMimeType>::reserve(result,asize);
    pDVar8 = (this->m_mimetypeNames).q_hash.d;
    if (pDVar8 == (Data *)0x0) {
      pDVar8 = (Data *)0x0;
      uVar9 = 0;
LAB_004aac56:
      if (uVar9 == 0 && pDVar8 == (Data *)0x0) goto LAB_004aad5a;
    }
    else {
      if (pDVar8->spans->offsets[0] == 0xff) {
        uVar6 = 1;
        do {
          uVar9 = uVar6;
          if (pDVar8->numBuckets == uVar9) {
            pDVar8 = (Data *)0x0;
            uVar9 = 0;
            break;
          }
          uVar6 = uVar9 + 1;
        } while (pDVar8->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
        goto LAB_004aac56;
      }
      uVar9 = 0;
    }
    do {
      pEVar2 = pDVar8->spans[uVar9 >> 7].entries;
      bVar1 = pDVar8->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f];
      local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
      local_68.name.d.d = *(Data **)pEVar2[bVar1].storage.data;
      local_68.name.d.ptr = *(char16_t **)(pEVar2[bVar1].storage.data + 8);
      local_68.name.d.size = *(qsizetype *)(pEVar2[bVar1].storage.data + 0x10);
      if (&(local_68.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1
        ;
        UNLOCK();
      }
      QMimeType::QMimeType(local_48,&local_68);
      QtPrivate::QMovableArrayOps<QMimeType>::emplace<QMimeType>
                ((QMovableArrayOps<QMimeType> *)result,(result->d).size,local_48);
      QList<QMimeType>::end(result);
      QMimeType::~QMimeType(local_48);
      if (&(local_68.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
           ) {
          QArrayData::deallocate(&(local_68.name.d.d)->super_QArrayData,2,0x10);
        }
      }
      do {
        if (pDVar8->numBuckets - 1 == uVar9) {
          uVar9 = 0;
          pDVar8 = (Data *)0x0;
          break;
        }
        uVar9 = uVar9 + 1;
      } while (pDVar8->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
    } while ((uVar9 != 0) || (pDVar8 != (Data *)0x0));
    goto LAB_004aad5a;
  }
  if (pDVar8 == (Data *)0x0) {
    pDVar8 = (Data *)0x0;
    uVar9 = 0;
LAB_004aa8f9:
    if (pDVar8 == (Data *)0x0 && uVar9 == 0) goto LAB_004aad5a;
  }
  else {
    if (pDVar8->spans->offsets[0] == 0xff) {
      uVar6 = 1;
      do {
        uVar9 = uVar6;
        if (pDVar8->numBuckets == uVar9) {
          pDVar8 = (Data *)0x0;
          uVar9 = 0;
          break;
        }
        uVar6 = uVar9 + 1;
      } while (pDVar8->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
      goto LAB_004aa8f9;
    }
    uVar9 = 0;
  }
  do {
    pEVar2 = pDVar8->spans[uVar9 >> 7].entries;
    bVar1 = pDVar8->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f];
    pQVar13 = (result->d).ptr;
    lVar3 = (result->d).size;
    data = *(QArrayData **)pEVar2[bVar1].storage.data;
    pQVar4 = *(QArrayData **)(pEVar2[bVar1].storage.data + 8);
    pcVar5 = *(char16_t **)(pEVar2[bVar1].storage.data + 0x10);
    if (data == (QArrayData *)0x0) {
      local_68._0_8_ = (QArrayData *)0x0;
    }
    else {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_68._0_8_ = data;
    }
    __it.i = pQVar13;
    lVar12 = lVar3;
    local_68.name.d.d = (Data *)pQVar4;
    local_68.name.d.ptr = pcVar5;
    if (0 < lVar3 >> 2) {
      lVar10 = (lVar3 >> 2) + 1;
      lVar12 = lVar3 * 8;
      do {
        bVar7 = __gnu_cxx::__ops::
                _Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                            *)&local_68,__it);
        cVar11.i = __it.i;
        if (bVar7) goto LAB_004aaad2;
        bVar7 = __gnu_cxx::__ops::
                _Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                            *)&local_68,__it.i + 1);
        cVar11.i = __it.i + 1;
        if (bVar7) goto LAB_004aaad2;
        bVar7 = __gnu_cxx::__ops::
                _Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                            *)&local_68,__it.i + 2);
        cVar11.i = __it.i + 2;
        if (bVar7) goto LAB_004aaad2;
        bVar7 = __gnu_cxx::__ops::
                _Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                            *)&local_68,__it.i + 3);
        cVar11.i = __it.i + 3;
        if (bVar7) goto LAB_004aaad2;
        __it.i = __it.i + 4;
        lVar10 = lVar10 + -1;
        lVar12 = lVar12 + -0x20;
      } while (1 < lVar10);
      lVar12 = lVar12 >> 3;
    }
    if (lVar12 == 1) {
LAB_004aaabf:
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                        ((_Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::__0> *
                         )&local_68,__it);
      cVar11.i = pQVar13 + lVar3;
      if (bVar7) {
        cVar11.i = __it.i;
      }
    }
    else if (lVar12 == 2) {
LAB_004aaa94:
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                        ((_Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::__0> *
                         )&local_68,__it);
      cVar11.i = __it.i;
      if (!bVar7) {
        __it.i = __it.i + 1;
        goto LAB_004aaabf;
      }
    }
    else {
      cVar11.i = pQVar13 + lVar3;
      if ((lVar12 == 3) &&
         (bVar7 = __gnu_cxx::__ops::
                  _Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::
                  operator()((_Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                              *)&local_68,__it), cVar11.i = __it.i, !bVar7)) {
        __it.i = __it.i + 1;
        goto LAB_004aaa94;
      }
    }
LAB_004aaad2:
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    if (data == (QArrayData *)0x0) {
      pQVar13 = (result->d).ptr + (result->d).size;
    }
    else {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
      pQVar13 = (result->d).ptr + (result->d).size;
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
    if (cVar11.i == pQVar13) {
      pEVar2 = pEVar2 + bVar1;
      local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
      local_68.name.d.d = *(Data **)(pEVar2->storage).data;
      local_68.name.d.ptr = *(char16_t **)((pEVar2->storage).data + 8);
      local_68.name.d.size = *(qsizetype *)((pEVar2->storage).data + 0x10);
      if (&(local_68.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1
        ;
        UNLOCK();
      }
      QMimeType::QMimeType(local_48,&local_68);
      QtPrivate::QMovableArrayOps<QMimeType>::emplace<QMimeType>
                ((QMovableArrayOps<QMimeType> *)result,(result->d).size,local_48);
      QList<QMimeType>::end(result);
      QMimeType::~QMimeType(local_48);
      if (&(local_68.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
           ) {
          QArrayData::deallocate(&(local_68.name.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    do {
      if (pDVar8->numBuckets - 1 == uVar9) {
        pDVar8 = (Data *)0x0;
        uVar9 = 0;
        break;
      }
      uVar9 = uVar9 + 1;
    } while (pDVar8->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
  } while ((pDVar8 != (Data *)0x0) || (uVar9 != 0));
LAB_004aad5a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType> &result)
{
    loadMimeTypeList();
    if (result.isEmpty()) {
        result.reserve(m_mimetypeNames.size());
        for (const QString &name : std::as_const(m_mimetypeNames))
            result.append(QMimeType(QMimeTypePrivate(name)));
    } else {
        for (const QString &name : std::as_const(m_mimetypeNames))
            if (std::find_if(result.constBegin(), result.constEnd(), [name](const QMimeType &mime) -> bool { return mime.name() == name; })
                    == result.constEnd())
                result.append(QMimeType(QMimeTypePrivate(name)));
    }
}